

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

uint __thiscall Clock::GetTimeDelta(Clock *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = clock_ticks();
  uVar2 = uVar1 - this->last;
  if ((int)uVar2 < 0) {
    Console::Wrn("A time delta of %i ms was detected and ignored.",(ulong)uVar2);
    uVar2 = 0;
  }
  if (this->max_delta < (int)uVar2) {
    Console::Wrn("A time delta of %i ms was detected and ignored.",(ulong)uVar2);
    uVar2 = this->max_delta;
  }
  this->last = uVar1;
  return uVar2;
}

Assistant:

unsigned int Clock::GetTimeDelta()
{
	unsigned int ticks = clock_ticks();
	unsigned int delta = ticks - last;

	if ((int)delta < 0)
	{
		Console::Wrn("A time delta of %i ms was detected and ignored.", delta);
		delta = 0;
	}

	if ((int)delta > max_delta)
	{
		Console::Wrn("A time delta of %i ms was detected and ignored.", delta);
		delta = max_delta;
	}

	last = ticks;

	return delta;
}